

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O3

vector<uint256,_std::allocator<uint256>_> * __thiscall
CCoinsViewDB::GetHeadBlocks
          (vector<uint256,_std::allocator<uint256>_> *__return_storage_ptr__,CCoinsViewDB *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = CDBWrapper::Read<unsigned_char,std::vector<uint256,std::allocator<uint256>>>
                    ((this->m_db)._M_t.
                     super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                     super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                     super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl,"HC12CCoinsViewDB",
                     &local_28);
  if (bVar1) {
    (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_28.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_28.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_28.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_28.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<uint256> CCoinsViewDB::GetHeadBlocks() const {
    std::vector<uint256> vhashHeadBlocks;
    if (!m_db->Read(DB_HEAD_BLOCKS, vhashHeadBlocks)) {
        return std::vector<uint256>();
    }
    return vhashHeadBlocks;
}